

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

void bf_read_buffer(bfile_t *bfile)

{
  size_t sVar1;
  long in_RDI;
  bool bVar2;
  size_t b;
  size_t bytes;
  float local_34;
  float local_1c;
  ulong local_10;
  
  if (*(long *)(in_RDI + 0x40) != 0) {
    local_1c = (float)*(ulong *)(in_RDI + 0x20);
    local_34 = (float)*(ulong *)(in_RDI + 0x10);
    (**(code **)(in_RDI + 0x40))(local_1c / local_34,*(undefined8 *)(in_RDI + 0x48));
  }
  if (*(long *)(in_RDI + 0x20) != *(long *)(in_RDI + 0x10)) {
    local_10 = 0;
    while( true ) {
      bVar2 = false;
      if (local_10 < *(uint *)(in_RDI + 0x38)) {
        bVar2 = *(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x10);
      }
      if (!bVar2) break;
      sVar1 = fread((void *)(*(long *)(in_RDI + 0x30) + local_10),1,
                    *(uint *)(in_RDI + 0x38) - local_10,*(FILE **)(in_RDI + 8));
      if (sVar1 == 0) {
        fprintf(_stderr,"Error: fread() returned 0.\n");
      }
      else {
        local_10 = sVar1 + local_10;
        *(size_t *)(in_RDI + 0x20) = sVar1 + *(long *)(in_RDI + 0x20);
      }
    }
  }
  return;
}

Assistant:

static
void
bf_read_buffer(
    bfile_t * bfile )
{
    size_t bytes;

    if ( bfile->progress_cb ) {
        bfile->progress_cb( (float)bfile->ipos / (float)bfile->size,
            bfile->progress_data);
    }

    if ( bfile->ipos == bfile->size )
        /* file completely read */
        return;

    bytes = 0;
    while ( (bytes < bfile->buffer_size) && (bfile->ipos < bfile->size) ) {
        size_t b;
        b = fread( bfile->buffer + bytes, 1, bfile->buffer_size - bytes,
                   bfile->file );
        if ( b != 0 ) {
            bytes += b;
            bfile->ipos += b;
        } else {
            fprintf( stderr, "Error: fread() returned 0.\n" );
        }
    }
}